

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O2

void __thiscall QWidgetResizeHandler::doResize(QWidgetResizeHandler *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidget *pQVar5;
  QWidgetData *pQVar6;
  uint uVar7;
  QPoint QVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  QRect QVar12;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)this[0x40] & 4) != 0) {
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] | 2);
    pQVar5 = *(QWidget **)(this + 0x10);
    local_28 = (QPoint)QCursor::pos();
    QVar8 = QWidget::mapFromGlobal(pQVar5,&local_28);
    *(QPoint *)(this + 0x20) = QVar8;
    pQVar6 = (*(QWidget **)(this + 0x10))->data;
    uVar1 = (pQVar6->crect).x2;
    uVar3 = (pQVar6->crect).y2;
    uVar2 = (pQVar6->crect).x1;
    uVar4 = (pQVar6->crect).y1;
    iVar10 = -(uint)(QVar8.xp.m_i.m_i < ((uVar1 - uVar2) + 1) / 2);
    iVar11 = -(uint)(QVar8.yp.m_i.m_i < ((uVar3 - uVar4) + 1) / 2);
    auVar9._4_4_ = iVar10;
    auVar9._0_4_ = iVar10;
    auVar9._8_4_ = iVar11;
    auVar9._12_4_ = iVar11;
    uVar7 = movmskpd(QVar8.xp.m_i.m_i,auVar9);
    iVar10 = (uVar7 & 0xfffffffe) + 2;
    if ((uVar7 & 1) != 0) {
      iVar10 = (uint)((uVar7 & 2) == 0) * 2 + 1;
    }
    *(int *)(this + 0x30) = iVar10;
    QVar12 = QWidget::rect(*(QWidget **)(this + 0x10));
    *(ulong *)(this + 0x28) =
         CONCAT44(QVar12.y2.m_i.m_i - *(int *)(this + 0x24),
                  QVar12.x2.m_i.m_i - *(int *)(this + 0x20));
    setMouseCursor(this,*(MousePosition *)(this + 0x30));
    pQVar5 = *(QWidget **)(this + 0x10);
    QWidget::cursor((QWidget *)&local_28);
    QWidget::grabMouse(pQVar5,(QCursor *)&local_28);
    QCursor::~QCursor((QCursor *)&local_28);
    QWidget::grabKeyboard(*(QWidget **)(this + 0x10));
    resizeHorizontalDirectionFixed = 0;
    resizeVerticalDirectionFixed = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetResizeHandler::doResize()
{
    if (!enabled)
        return;

    active = true;
    moveOffset = widget->mapFromGlobal(QCursor::pos());
    if (moveOffset.x() < widget->width()/2) {
        if (moveOffset.y() < widget->height()/2)
            mode = TopLeft;
        else
            mode = BottomLeft;
    } else {
        if (moveOffset.y() < widget->height()/2)
            mode = TopRight;
        else
            mode = BottomRight;
    }
    invertedMoveOffset = widget->rect().bottomRight() - moveOffset;
#ifndef QT_NO_CURSOR
    setMouseCursor(mode);
    widget->grabMouse(widget->cursor() );
#else
    widget->grabMouse();
#endif
    widget->grabKeyboard();
    resizeHorizontalDirectionFixed = false;
    resizeVerticalDirectionFixed = false;
}